

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O1

Inet_addr * __thiscall iqnet::Socket::get_addr(Inet_addr *__return_storage_ptr__,Socket *this)

{
  int iVar1;
  network_error *this_00;
  socklen_t saddr_len;
  sockaddr_in saddr;
  socklen_t local_54;
  string local_50;
  SystemSockAddrIn local_30;
  
  local_54 = 0x10;
  iVar1 = getsockname(this->sock,(sockaddr *)&local_30,&local_54);
  if (iVar1 != -1) {
    Inet_addr::Inet_addr(__return_storage_ptr__,&local_30);
    return __return_storage_ptr__;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Socket::get_addr","");
  network_error::network_error(this_00,&local_50,true,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Inet_addr Socket::get_addr() const
{
  sockaddr_in saddr;
  socklen_t saddr_len = sizeof(saddr);

  if (::getsockname(sock, reinterpret_cast<sockaddr*>(&saddr), &saddr_len) == -1)
    throw network_error( "Socket::get_addr" );

  return Inet_addr(reinterpret_cast<const sockaddr_in&>(saddr));
}